

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O2

vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
* absl::cord_internal::CordzHandle::DiagnosticsGetDeleteQueue(void)

{
  vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  *in_RDI;
  MutexLock lock;
  value_type local_20;
  MutexLock local_18;
  
  (in_RDI->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_0::GlobalQueue();
  local_18.mu_ = (Mutex *)&anon_unknown_0::GlobalQueue::global_queue;
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  for (local_20 = (value_type)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
      local_20 != (CordzHandle *)0x0; local_20 = local_20->dq_prev_) {
    std::
    vector<const_absl::cord_internal::CordzHandle_*,_std::allocator<const_absl::cord_internal::CordzHandle_*>_>
    ::push_back(in_RDI,&local_20);
  }
  MutexLock::~MutexLock(&local_18);
  return in_RDI;
}

Assistant:

std::vector<const CordzHandle*> CordzHandle::DiagnosticsGetDeleteQueue() {
  std::vector<const CordzHandle*> handles;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  CordzHandle* dq_tail = global_queue.dq_tail.load(std::memory_order_acquire);
  for (const CordzHandle* p = dq_tail; p; p = p->dq_prev_) {
    handles.push_back(p);
  }
  return handles;
}